

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

int __thiscall libchars::validation::add_validator__(validation *this,id_t id,validator *v)

{
  mapped_type mVar1;
  iterator iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *ppvVar5;
  int iVar6;
  mapped_type local_34 [2];
  id_t id_local;
  
  iVar6 = -1;
  if (id != 0 && v != (validator *)0x0) {
    local_34[0] = id;
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_const_libchars::validator_*>,_std::_Select1st<std::pair<const_int,_const_libchars::validator_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
            ::find(&(this->i2v)._M_t,local_34);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->i2v)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(v + 0x18) != 0) {
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)this,(key_type *)(v + 0x10));
        mVar1 = local_34[0];
        if ((_Rb_tree_header *)iVar3._M_node != &(this->n2i)._M_t._M_impl.super__Rb_tree_header) {
          return -1;
        }
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->n2i,(key_type *)(v + 0x10));
        *pmVar4 = mVar1;
      }
      ppvVar5 = std::
                map<int,_const_libchars::validator_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_libchars::validator_*>_>_>
                ::operator[](&this->i2v,local_34);
      *ppvVar5 = v;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int validation::add_validator__(validator::id_t id, const validator *v)
    {
        if (v == NULL)
            return -1;
        if (id == validator::NONE)
            return -1;

        validators_by_id_t::const_iterator ii = i2v.find(id);
        if (ii != i2v.end())
            return -1; // duplicate

        if (!v->name.empty()) {
            vtype_by_name_t::const_iterator ni = n2i.find(v->name);
            if (ni != n2i.end())
                return -1; // duplicate
            n2i[v->name] = id;
        }

        i2v[id] = v;

        return 0;
    }